

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

string * __thiscall Matrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  long lVar5;
  ostringstream out;
  string local_1d0;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\begin{bmatrix}",0xf);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  cVar4 = (char)(ostream *)local_1a8;
  std::ostream::put(cVar4);
  std::ostream::flush();
  uVar3 = 0;
  local_1b0 = __return_storage_ptr__;
  while ((long)uVar3 < (long)this->n_) {
    if (0 < this->m_) {
      lVar5 = 0;
      uVar2 = 0;
      do {
        Fraction::ToLaTex_abi_cxx11_
                  (&local_1d0,
                   (Fraction *)
                   (*(long *)&(this->elements_).
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar3].
                              super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                              super__Vector_impl_data + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        uVar2 = uVar2 + 1;
        if (uVar2 != (uint)this->m_) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," & ",3);
        }
        lVar5 = lVar5 + 8;
      } while ((long)uVar2 < (long)this->m_);
    }
    uVar3 = uVar3 + 1;
    if (uVar3 != (uint)this->n_) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," \\\\",3);
    }
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\end{bmatrix}",0xd);
  psVar1 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string Matrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int i = 0; i < n_; ++i) {
    for (int j = 0; j < m_; ++j) {
      out << elements_[i][j].ToLaTex();
      if (j + 1 != m_) {
        out << " & ";
      }
    }
    if (i + 1 != n_) {
      out << " \\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}